

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void autocorr_fft(auto_fft_object obj,double *vec,double *acorr,int M)

{
  double dVar1;
  int local_34;
  int N;
  int i;
  double var;
  int M_local;
  double *acorr_local;
  double *vec_local;
  auto_fft_object obj_local;
  
  if (obj->clen < M) {
    var._4_4_ = obj->clen + -1;
    printf(
          "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n"
          );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    var._4_4_ = M;
    if (M < 0) {
      var._4_4_ = 0;
    }
  }
  autocovar_fft(obj,vec,acorr,var._4_4_);
  dVar1 = *acorr;
  *acorr = 1.0;
  for (local_34 = 1; local_34 < var._4_4_; local_34 = local_34 + 1) {
    acorr[local_34] = acorr[local_34] / dVar1;
  }
  return;
}

Assistant:

void autocorr_fft(auto_fft_object obj,double* vec,double* acorr, int M) {
	double var;
	int i,N;
	N = obj->clen;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar_fft(obj,vec,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}